

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_reset(void)

{
  store_conflict *store;
  store_conflict *s;
  wchar_t j;
  wchar_t i;
  
  for (s._4_4_ = 0; s._4_4_ < (int)(uint)z_info->store_max; s._4_4_ = s._4_4_ + 1) {
    store = stores + s._4_4_;
    store->stock_num = '\0';
    store_shuffle(store);
    object_pile_free((chunk *)0x0,(chunk *)0x0,store->stock_k);
    object_pile_free((chunk *)0x0,(chunk *)0x0,store->stock);
    store->stock_k = (object *)0x0;
    store->stock = (object *)0x0;
    if (store->feat != 0xe) {
      for (s._0_4_ = 0; (int)s < 10; s._0_4_ = (int)s + 1) {
        store_maint(store);
      }
    }
  }
  return;
}

Assistant:

void store_reset(void) {
	int i, j;
	struct store *s;

	for (i = 0; i < z_info->store_max; i++) {
		s = &stores[i];
		s->stock_num = 0;
		store_shuffle(s);
		object_pile_free(NULL, NULL, s->stock_k);
		object_pile_free(NULL, NULL, s->stock);
		s->stock_k = NULL;
		s->stock = NULL;
		if (s->feat == FEAT_HOME)
			continue;
		for (j = 0; j < 10; j++)
			store_maint(s);
	}
}